

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O3

Value * __thiscall
soul::CompileTimeIntrinsicEvaluation::perform<long,long>
          (Value *__return_storage_ptr__,CompileTimeIntrinsicEvaluation *this,
          ArrayView<soul::Value> args,_func_long_long *fn)

{
  int64_t iVar1;
  Value *extraout_RAX;
  long v;
  PackedData PStack_28;
  
  if ((long)args.s - (long)this != 0x40) {
    throwInternalCompilerError("args.size() == 1","perform",0x22);
  }
  if ((Value *)this != args.s) {
    soul::Value::getData(&PStack_28,(Value *)this);
    iVar1 = soul::Value::PackedData::getAsInt64(&PStack_28);
    v = -iVar1;
    if (0 < iVar1) {
      v = iVar1;
    }
    soul::Value::Value(__return_storage_ptr__,v);
    return extraout_RAX;
  }
  throwInternalCompilerError("! empty()","front",0xbf);
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}